

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  uint *puVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined4 in_register_0000008c;
  ulong uVar11;
  uint *puVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  SmallVector<int,_32UL> row;
  int local_f0;
  int local_ec;
  size_t local_e8;
  undefined8 local_e0;
  uint *local_d8;
  int *local_d0;
  SmallVector<int,_32UL> local_c8;
  int iVar5;
  
  local_e0 = CONCAT44(in_register_0000008c,maxDistance);
  local_e8 = left._M_len;
  uVar7 = right._M_len;
  SmallVector<int,_32UL>::SmallVector(&local_c8,uVar7);
  local_f0 = 0;
  if (-1 < (int)right._M_len) {
    do {
      SmallVectorBase<int>::emplace_back<int_const&>(&local_c8.super_SmallVectorBase<int>,&local_f0)
      ;
      iVar4 = local_f0 + 1;
      bVar3 = local_f0 < (int)right._M_len;
      local_f0 = iVar4;
    } while (bVar3);
  }
  if (local_e8 != 0) {
    if (local_c8.super_SmallVectorBase<int>.len == 0) {
      assert::assertFailed
                ("index < len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                 ,0x196,"reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
    }
    iVar5 = (int)local_e0;
    iVar4 = iVar5 + 1;
    local_d0 = local_c8.super_SmallVectorBase<int>.data_;
    local_d8 = (uint *)(local_c8.super_SmallVectorBase<int>.data_ + 1);
    uVar9 = 1;
    do {
      iVar8 = (int)uVar9;
      *local_c8.super_SmallVectorBase<int>.data_ = iVar8;
      local_ec = iVar4;
      if (uVar7 != 0) {
        uVar1 = uVar9 - 1;
        uVar11 = 1;
        uVar14 = uVar9 & 0xffffffff;
        uVar13 = uVar1 & 0xffffffff;
        uVar10 = uVar9 & 0xffffffff;
        puVar12 = local_d8;
        do {
          if (local_c8.super_SmallVectorBase<int>.len == uVar11) {
            assert::assertFailed
                      ("index < len",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                       ,0x196,
                       "reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
          }
          uVar15 = (uint)uVar13;
          uVar2 = *puVar12;
          uVar13 = (ulong)uVar2;
          if (allowReplacements) {
            uVar16 = uVar15 + (left._M_str[uVar1] != right._M_str[uVar11 - 1]);
            puVar6 = puVar12 + -1;
            if ((int)uVar2 < (int)uVar14) {
              puVar6 = puVar12;
            }
            uVar15 = *puVar6 + 1;
            if ((int)uVar16 <= (int)(*puVar6 + 1)) {
              uVar15 = uVar16;
            }
          }
          else if (left._M_str[uVar1] != right._M_str[uVar11 - 1]) {
            puVar6 = puVar12 + -1;
            if ((int)uVar2 < (int)uVar14) {
              puVar6 = puVar12;
            }
            uVar15 = *puVar6 + 1;
          }
          *puVar12 = uVar15;
          if ((int)uVar15 < (int)uVar10) {
            uVar10 = (ulong)uVar15;
          }
          iVar8 = (int)uVar10;
          uVar11 = uVar11 + 1;
          puVar12 = puVar12 + 1;
          uVar14 = (ulong)uVar15;
        } while (uVar11 <= uVar7);
      }
      if ((iVar5 != 0) && (iVar5 < iVar8)) goto LAB_001bcb55;
      uVar9 = uVar9 + 1;
    } while (uVar9 <= local_e8);
  }
  if (local_c8.super_SmallVectorBase<int>.len <= uVar7) {
    assert::assertFailed
              ("index < len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x196,"reference slang::SmallVectorBase<int>::operator[](size_type) [T = int]");
  }
  iVar4 = local_c8.super_SmallVectorBase<int>.data_[uVar7];
LAB_001bcb55:
  if (local_c8.super_SmallVectorBase<int>.data_ !=
      (pointer)local_c8.super_SmallVectorBase<int>.firstElement) {
    free(local_c8.super_SmallVectorBase<int>.data_);
  }
  return iVar4;
}

Assistant:

int editDistance(string_view left, string_view right, bool allowReplacements, int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}